

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_image(nk_context *ctx,nk_image img)

{
  nk_rect r;
  nk_widget_layout_states nVar1;
  long in_RDI;
  nk_rect bounds;
  nk_window *win;
  nk_context *in_stack_ffffffffffffffd0;
  nk_command_buffer *in_stack_ffffffffffffffd8;
  nk_color in_stack_ffffffffffffffe4;
  nk_image *in_stack_ffffffffffffffe8;
  undefined8 uVar2;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x3fc8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0) != 0)) {
    uVar2 = *(undefined8 *)(in_RDI + 0x3fc8);
    nVar1 = nk_widget((nk_rect *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (nVar1 != NK_WIDGET_INVALID) {
      r.w = (float)(int)uVar2;
      r.h = (float)(int)((ulong)uVar2 >> 0x20);
      r._0_8_ = in_stack_ffffffffffffffe8;
      nk_draw_image(in_stack_ffffffffffffffd8,r,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4)
      ;
    }
  }
  return;
}

Assistant:

NK_API void
nk_image(struct nk_context *ctx, struct nk_image img)
{
    struct nk_window *win;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return;

    win = ctx->current;
    if (!nk_widget(&bounds, ctx)) return;
    nk_draw_image(&win->buffer, bounds, &img, nk_white);
}